

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::isModuleOrPackageDecl(SyntaxKind kind)

{
  if ((((((0x31 < kind - CheckerDeclaration) ||
         ((0x3900100000009U >> ((ulong)(kind - CheckerDeclaration) & 0x3f) & 1) == 0)) &&
        ((0x3b < kind - NetDeclaration ||
         ((0x800000011000005U >> ((ulong)(kind - NetDeclaration) & 0x3f) & 1) == 0)))) &&
       ((0x35 < kind - ElabSystemTask ||
        ((0x30000000000401U >> ((ulong)(kind - ElabSystemTask) & 0x3f) & 1) == 0)))) &&
      ((0x35 < kind - TaskDeclaration ||
       ((0x20000000040001U >> ((ulong)(kind - TaskDeclaration) & 0x3f) & 1) == 0)))) &&
     ((kind != LetDeclaration && (kind != SequenceDeclaration)))) {
    return false;
  }
  return true;
}

Assistant:

static bool isModuleOrPackageDecl(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::NetDeclaration:
        case SyntaxKind::UserDefinedNetDeclaration:
        case SyntaxKind::NetTypeDeclaration:
        case SyntaxKind::TypedefDeclaration:
        case SyntaxKind::ForwardTypedefDeclaration:
        case SyntaxKind::PackageImportDeclaration:
        case SyntaxKind::DataDeclaration:
        case SyntaxKind::TaskDeclaration:
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::DPIImport:
        case SyntaxKind::DPIExport:
        case SyntaxKind::ClassDeclaration:
        case SyntaxKind::ParameterDeclarationStatement:
        case SyntaxKind::CovergroupDeclaration:
        case SyntaxKind::EmptyMember:
        case SyntaxKind::PropertyDeclaration:
        case SyntaxKind::SequenceDeclaration:
        case SyntaxKind::LetDeclaration:
        case SyntaxKind::ConstraintDeclaration:
        case SyntaxKind::CheckerDeclaration:
        case SyntaxKind::ElabSystemTask:
            return true;
        default:
            return false;
    }
}